

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# seq.c
# Opt level: O2

void * coll_seq_insert_at(coll_seq_t *seq,void *data,size_t index)

{
  ulong uVar1;
  coll_seq_node_t *pcVar2;
  void *pvVar3;
  coll_seq_t *pcVar4;
  coll_seq_node_t *pcVar5;
  coll_seq_node_t *pcVar6;
  bool bVar7;
  
  if (seq != (coll_seq_t *)0x0) {
    uVar1 = seq->len;
    if (index <= uVar1) {
      if (uVar1 != index) {
        pcVar4 = seq;
        pcVar6 = (coll_seq_node_t *)0x0;
        while( true ) {
          pcVar2 = pcVar4->head;
          bVar7 = index == 0;
          index = index - 1;
          if (bVar7) break;
          pcVar4 = (coll_seq_t *)&pcVar2->next;
          pcVar6 = pcVar2;
        }
        pcVar5 = (coll_seq_node_t *)malloc(0x10);
        pcVar5->data = data;
        pcVar4 = (coll_seq_t *)&pcVar6->next;
        if (pcVar6 == (coll_seq_node_t *)0x0) {
          pcVar4 = seq;
        }
        pcVar5->next = pcVar2;
        pcVar4->head = pcVar5;
        seq->len = uVar1 + 1;
        return data;
      }
      pvVar3 = coll_seq_append(seq,data);
      return pvVar3;
    }
  }
  return (void *)0x0;
}

Assistant:

void *coll_seq_insert_at(coll_seq_t *seq, void *data, size_t index) {
    if (!seq || index > seq->len) {
        return NULL;
    } else if (index == seq->len) {
        return coll_seq_append(seq, data);
    }
    node_t *prev = NULL, *cur = seq->head;
    for (size_t i = 0; i < index; ++i) {
        prev = cur;
        cur = cur->next;
    }
    node_t *node = malloc(sizeof(node_t));
    node->data = data;
    node->next = cur;
    if (prev) {
        prev->next = node;
    } else {
        seq->head = node;
    }
    ++(seq->len);
    return data;
}